

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool openjtalk_speakToFileSjis(OpenJTalk *oj,char *textSjis,char *fileSjis)

{
  _Bool _Var1;
  char *pcVar2;
  FILE *__stream;
  char file_utf8 [260];
  char acStack_128 [272];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (((textSjis == (char *)0x0 || fileSjis == (char *)0x0) || (*fileSjis == '\0')) ||
       (*textSjis == '\0')) {
      oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      pcVar2 = sjistou8_path(fileSjis,acStack_128);
      if (pcVar2 != (char *)0x0) {
        __stream = fopen(acStack_128,"wb");
        if (__stream == (FILE *)0x0) {
          oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
        }
        else {
          pcVar2 = sjistou8(textSjis);
          if (pcVar2 != (char *)0x0) {
            _Var1 = generate_wavFile(oj,pcVar2,(FILE *)__stream);
            free(pcVar2);
            fclose(__stream);
            return _Var1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFileSjis(OpenJTalk *oj, const char *textSjis, const char *fileSjis)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (fileSjis == NULL || textSjis == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlen(fileSjis) == 0 || strlen(textSjis) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	FILE *wavfp = fopen(fileSjis, u8"wb");
#else
	char file_utf8[MAX_PATH];
	if (!sjistou8_path(fileSjis, file_utf8))
	{
		return false;
	}
	FILE *wavfp = fopen(file_utf8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	char *buf = sjistou8(textSjis);
	if (!buf)
	{
		return false;
	}
	bool result = generate_wavFile(oj, buf, wavfp);
	free(buf);
	fclose(wavfp);
	return result;
}